

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall Assimp::SMDImporter::ReadSmd(SMDImporter *this,string *pFile,IOSystem *pIOHandler)

{
  pointer pBVar1;
  pointer pBVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  runtime_error *this_00;
  long *plVar5;
  long *plVar6;
  pointer this_01;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IOStream *stream;
  
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rb","");
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_70);
  stream = (IOStream *)CONCAT44(extraout_var,iVar3);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (stream == (IOStream *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open SMD/VTA file ",pFile);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = (long *)*plVar5;
    plVar6 = plVar5 + 2;
    if (local_70 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar6;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_70);
    *(undefined ***)this_00 = &PTR__runtime_error_008bf448;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = (*stream->_vptr_IOStream[6])(stream);
  this->iFileSize = uVar4;
  std::vector<char,_std::allocator<char>_>::resize(&this->mBuffer,(ulong)(uVar4 + 1));
  BaseImporter::TextFileToBuffer(stream,&this->mBuffer,FORBID_EMPTY);
  this->iSmallestFrame = 0x7fffffff;
  this->bHasUVs = true;
  this->iLineNumber = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->aszTextures,10);
  std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::reserve
            (&this->asTriangles,1000);
  std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::reserve(&this->asBones,0x14);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->aszTextures,
                    (this->aszTextures).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::_M_erase_at_end
            (&this->asTriangles,
             (this->asTriangles).
             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
             super__Vector_impl_data._M_start);
  pBVar1 = (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pBVar1;
  if (pBVar2 != pBVar1) {
    do {
      SMD::Bone::~Bone(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pBVar2);
    (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
    _M_impl.super__Vector_impl_data._M_finish = pBVar1;
  }
  ParseFile(this);
  (*stream->_vptr_IOStream[1])(stream);
  return;
}

Assistant:

void SMDImporter::ReadSmd(const std::string &pFile, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file(pIOHandler->Open(pFile, "rb"));

    // Check whether we can read from the file
    if (file.get() == nullptr) {
        throw DeadlyImportError("Failed to open SMD/VTA file " + pFile + ".");
    }

    iFileSize = (unsigned int)file->FileSize();

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer.resize(iFileSize + 1);
    TextFileToBuffer(file.get(), mBuffer);

    iSmallestFrame = INT_MAX;
    bHasUVs = true;
    iLineNumber = 1;

    // Reserve enough space for ... hm ... 10 textures
    aszTextures.reserve(10);

    // Reserve enough space for ... hm ... 1000 triangles
    asTriangles.reserve(1000);

    // Reserve enough space for ... hm ... 20 bones
    asBones.reserve(20);

    aszTextures.clear();
    asTriangles.clear();
    asBones.clear();

    // parse the file ...
    ParseFile();
}